

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysextest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  RtMidiOut *rtmidi;
  RtMidiIn *pRVar2;
  value_type_conflict local_cb;
  byte local_ca;
  value_type_conflict local_c9;
  int local_c8;
  value_type_conflict local_c1;
  int n;
  RtMidiError *error_1;
  RtMidiError *error;
  string local_a0 [38];
  undefined1 local_7a;
  allocator<char> local_79;
  string local_78 [48];
  uint local_48;
  uint local_44;
  uint nBytes;
  uint i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> message;
  RtMidiIn *midiin;
  RtMidiOut *midiout;
  char **argv_local;
  int argc_local;
  
  message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nBytes);
  if (argc != 2) {
    usage();
  }
  local_48 = atoi(argv[1]);
  rtmidi = (RtMidiOut *)operator_new(0x10);
  local_7a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"RtMidi Output Client",&local_79);
  RtMidiOut::RtMidiOut(rtmidi,0,local_78);
  local_7a = 0;
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  pRVar2 = (RtMidiIn *)operator_new(0x10);
  error._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"RtMidi Input Client",(allocator<char> *)((long)&error + 7));
  RtMidiIn::RtMidiIn(pRVar2,0,local_a0,100);
  error._6_1_ = 0;
  message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pRVar2;
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&error + 7));
  RtMidiIn::ignoreTypes
            ((RtMidiIn *)
             message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,false,true,true);
  bVar1 = chooseMidiPort((RtMidi *)
                         message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((bVar1) && (bVar1 = chooseMidiPort((RtMidi *)rtmidi), bVar1)) {
    RtMidiIn::setCallback
              ((RtMidiIn *)
               message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,mycallback,(void *)0x0);
    local_c1 = 0xf6;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nBytes,&local_c1);
    RtMidiOut::sendMessage(rtmidi,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nBytes);
    usleep(500000);
    for (local_c8 = 0; local_c8 < 2; local_c8 = local_c8 + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nBytes);
      local_c9 = 0xf0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nBytes,&local_c9);
      for (local_44 = 0; local_44 < local_48; local_44 = local_44 + 1) {
        local_ca = (byte)local_44 & 0x7f;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nBytes,&local_ca);
      }
      local_cb = 0xf7;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nBytes,&local_cb);
      RtMidiOut::sendMessage
                (rtmidi,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nBytes);
      usleep(500000);
    }
  }
  if (rtmidi != (RtMidiOut *)0x0) {
    (**(code **)(*(long *)rtmidi + 0x40))();
  }
  if (message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (**(code **)(*(long *)message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 0x40))();
  }
  error_1._4_4_ = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nBytes);
  return 0;
}

Assistant:

int main( int argc, char *argv[] )
{
  RtMidiOut *midiout = 0;
  RtMidiIn *midiin = 0;
  std::vector<unsigned char> message;
  unsigned int i, nBytes;

  // Minimal command-line check.
  if ( argc != 2 ) usage();
  nBytes = (unsigned int) atoi( argv[1] );

  // RtMidiOut and RtMidiIn constructors
  try {
    midiout = new RtMidiOut();
    midiin = new RtMidiIn();
  }
  catch ( RtMidiError &error ) {
    error.printMessage();
    goto cleanup;
  }

  // Don't ignore sysex, timing, or active sensing messages.
  midiin->ignoreTypes( false, true, true );

  try {
    if ( chooseMidiPort( midiin ) == false ) goto cleanup;
    if ( chooseMidiPort( midiout ) == false ) goto cleanup;
  }
  catch ( RtMidiError &error ) {
    error.printMessage();
    goto cleanup;
  }

  midiin->setCallback( &mycallback );

  message.push_back( 0xF6 );
  midiout->sendMessage( &message );
  SLEEP( 500 ); // pause a little

  // Create a long sysex message of numbered bytes and send it out ... twice.
  for ( int n=0; n<2; n++ ) {
    message.clear();
    message.push_back( 240 );
    for ( i=0; i<nBytes; i++ )
      message.push_back( i % 128 );
    message.push_back( 247 );
    midiout->sendMessage( &message );

    SLEEP( 500 ); // pause a little
  }

  // Clean up
 cleanup:
  delete midiout;
  delete midiin;

  return 0;
}